

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall testing::TestCase::failed_test_count(TestCase *this)

{
  long lVar1;
  bool bVar2;
  pointer ppTVar3;
  uint uVar4;
  int iVar5;
  pointer ppTVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppTVar6 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar3 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar6 == ppTVar3) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      uVar4 = 0;
      if ((*ppTVar6)->should_run_ == true) {
        bVar2 = TestResult::Failed(&(*ppTVar6)->result_);
        uVar4 = (uint)bVar2;
        ppTVar3 = (this->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      iVar5 = iVar5 + uVar4;
      ppTVar6 = ppTVar6 + 1;
    } while (ppTVar6 != ppTVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

int TestCase::failed_test_count() const {
  return CountIf(test_info_list_, TestFailed);
}